

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O1

int __thiscall
OpenMD::ForceMatrixDecomposition::getTopologicalDistance
          (ForceMatrixDecomposition *this,int atom1,int atom2)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  pvVar1 = (this->super_ForceDecomposition).toposForAtom.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)&pvVar1[atom1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data;
  lVar4 = (long)*(pointer *)
                 ((long)&pvVar1[atom1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8) - lVar2;
  if (lVar4 != 0) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (*(int *)(lVar2 + uVar5 * 4) == atom2) {
        return *(int *)(*(long *)&(this->super_ForceDecomposition).topoDist.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[atom1].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data + uVar5 * 4);
      }
      bVar3 = uVar6 < (ulong)(lVar4 >> 2);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  return 0;
}

Assistant:

int ForceMatrixDecomposition::getTopologicalDistance(int atom1, int atom2) {
    for (unsigned int j = 0; j < toposForAtom[atom1].size(); j++) {
      if (toposForAtom[atom1][j] == atom2) return topoDist[atom1][j];
    }
    return 0;
  }